

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_> tVar6;
  string *psVar7;
  cmTarget *this_00;
  cmGeneratorTarget *this_01;
  cmLocalGenerator *this_02;
  long *plVar8;
  size_type *psVar9;
  char *__format;
  cmOutputConverter *outputConverter;
  string *lib;
  pointer lib_00;
  string_view arg;
  string_view arg_00;
  string includes;
  string includeFlags;
  string definitions;
  string buildType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  __uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_1b0;
  __uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_1a8;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> local_1a0;
  string packageName;
  string mode;
  string language;
  string linkPath;
  string frameworkPath;
  undefined1 local_f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string linkFlags;
  string flags;
  string systemFile;
  cmStateSnapshot snapshot;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  tVar6.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       operator_new(0x6f0);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)
             tVar6.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,this);
  local_1b0._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       tVar6.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                          &local_1b0);
  if ((_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
      local_1b0._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl != (cmGlobalGenerator *)0x0) {
    (**(code **)(*(long *)local_1b0._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
  }
  local_1b0._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)0x0;
  snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
  snapshot.State = (this->CurrentSnapshot).State;
  snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&includes,&snapshot);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&includes,&includeFlags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&includes,&snapshot);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&includes,&includeFlags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  cmStateSnapshot::SetDefaultDefinitions(&snapshot);
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  tVar6.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       operator_new(0x7f8);
  cmMakefile::cmMakefile
            ((cmMakefile *)
             tVar6.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,pcVar2,&snapshot);
  local_1a0._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
       (_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)0x0;
  local_1a8._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       tVar6.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  cmGlobalGenerator::AddMakefile
            ((this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_1a8);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_1a8);
  cmMakefile::SetArgcArgv
            ((cmMakefile *)
             tVar6.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,args);
  includes._M_dataplus._M_p = (pointer)&includes.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&includes,"CMakeFindPackageMode.cmake","");
  cmMakefile::GetModulesFile
            (&systemFile,
             (cmMakefile *)
             tVar6.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::ReadListFile
            ((cmMakefile *)
             tVar6.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&systemFile);
  includes._M_dataplus._M_p = (pointer)&includes.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"LANGUAGE","");
  psVar7 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      tVar6.
                      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                      .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&includes);
  language._M_dataplus._M_p = (pointer)&language.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&language,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  includes._M_dataplus._M_p = (pointer)&includes.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"MODE","");
  psVar7 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      tVar6.
                      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                      .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&includes);
  mode._M_dataplus._M_p = (pointer)&mode.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&mode,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  includes._M_dataplus._M_p = (pointer)&includes.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"NAME","");
  psVar7 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      tVar6.
                      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                      .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&includes);
  packageName._M_dataplus._M_p = (pointer)&packageName.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&packageName,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  includes._M_dataplus._M_p = (pointer)&includes.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"PACKAGE_FOUND","");
  bVar4 = cmMakefile::IsOn((cmMakefile *)
                           tVar6.
                           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                           .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&includes
                          );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  includes._M_dataplus._M_p = (pointer)&includes.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"PACKAGE_QUIET","");
  bVar5 = cmMakefile::IsOn((cmMakefile *)
                           tVar6.
                           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                           .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&includes
                          );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    if (mode._M_string_length == 4) {
      if (*(int *)mode._M_dataplus._M_p == 0x4b4e494c) {
        srcs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        srcs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        srcs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        includes._M_dataplus._M_p = (pointer)&includes.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"dummy","");
        this_00 = cmMakefile::AddExecutable
                            ((cmMakefile *)
                             tVar6.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                             &includes,&srcs,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includes._M_dataplus._M_p != &includes.field_2) {
          operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
        }
        includes._M_dataplus._M_p = (pointer)&includes.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"LINKER_LANGUAGE","");
        cmTarget::SetProperty(this_00,&includes,&language);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includes._M_dataplus._M_p != &includes.field_2) {
          operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
        }
        includes._M_dataplus._M_p = (pointer)&includes.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"PACKAGE_LIBRARIES","");
        psVar7 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            tVar6.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                            &includes);
        definitions._M_dataplus._M_p = (pointer)&definitions.field_2;
        pcVar3 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&definitions,pcVar3,pcVar3 + psVar7->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includes._M_dataplus._M_p != &includes.field_2) {
          operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
        }
        arg_00._M_str = definitions._M_dataplus._M_p;
        arg_00._M_len = definitions._M_string_length;
        cmExpandedList_abi_cxx11_(&libList,arg_00,false);
        for (lib_00 = libList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lib_00 != libList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; lib_00 = lib_00 + 1) {
          cmTarget::AddLinkLibrary
                    (this_00,(cmMakefile *)
                             tVar6.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,lib_00,
                     GENERAL_LibraryType);
        }
        includes._M_dataplus._M_p = (pointer)&includes.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"CMAKE_BUILD_TYPE","");
        psVar7 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            tVar6.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                            &includes);
        buildType._M_dataplus._M_p = (pointer)&buildType.field_2;
        pcVar3 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&buildType,pcVar3,pcVar3 + psVar7->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includes._M_dataplus._M_p != &includes.field_2) {
          operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
        }
        cmsys::SystemTools::UpperCase(&includes,&buildType);
        std::__cxx11::string::operator=((string *)&buildType,(string *)&includes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includes._M_dataplus._M_p != &includes.field_2) {
          operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
        }
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&includeDirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
        frameworkPath._M_string_length = 0;
        frameworkPath.field_2._M_local_buf[0] = '\0';
        linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
        linkPath._M_string_length = 0;
        linkPath.field_2._M_local_buf[0] = '\0';
        flags._M_string_length = 0;
        flags.field_2._M_local_buf[0] = '\0';
        linkFlags._M_string_length = 0;
        linkFlags.field_2._M_local_buf[0] = '\0';
        linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
        flags._M_dataplus._M_p = (pointer)&flags.field_2;
        cmGlobalGenerator::CreateGenerationObjects
                  ((this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,AllTargets);
        pcVar2 = (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        psVar7 = cmTarget::GetName_abi_cxx11_(this_00);
        this_01 = cmGlobalGenerator::FindGeneratorTarget(pcVar2,psVar7);
        this_02 = cmGeneratorTarget::GetLocalGenerator(this_01);
        outputConverter = &this_02->super_cmOutputConverter;
        if (this_02 == (cmLocalGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_f8,this_02);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&includeFlags,(cmStateSnapshot *)local_f8)
        ;
        cmLinkLineComputer::cmLinkLineComputer
                  ((cmLinkLineComputer *)&includes,outputConverter,(cmStateDirectory *)&includeFlags
                  );
        cmLocalGenerator::GetTargetFlags
                  (this_02,(cmLinkLineComputer *)&includes,&buildType,(string *)&includeDirs,&flags,
                   &linkFlags,&frameworkPath,&linkPath,this_01);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,&frameworkPath,&linkPath);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   (local_f8,(ulong)includeDirs.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
        psVar9 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar9) {
          includeFlags.field_2._M_allocated_capacity = *psVar9;
          includeFlags.field_2._8_8_ = plVar8[3];
          includeFlags._M_dataplus._M_p = (pointer)&includeFlags.field_2;
        }
        else {
          includeFlags.field_2._M_allocated_capacity = *psVar9;
          includeFlags._M_dataplus._M_p = (pointer)*plVar8;
        }
        includeFlags._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&includeDirs,(string *)&includeFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
          operator_delete(includeFlags._M_dataplus._M_p,
                          includeFlags.field_2._M_allocated_capacity + 1);
        }
        if ((cmState *)local_f8._0_8_ != (cmState *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        puts((char *)includeDirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)&includes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
          operator_delete(linkFlags._M_dataplus._M_p,
                          CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                   linkFlags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)flags._M_dataplus._M_p != &flags.field_2) {
          operator_delete(flags._M_dataplus._M_p,
                          CONCAT71(flags.field_2._M_allocated_capacity._1_7_,
                                   flags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
          operator_delete(linkPath._M_dataplus._M_p,
                          CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                   linkPath.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
          operator_delete(frameworkPath._M_dataplus._M_p,
                          CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                                   frameworkPath.field_2._M_local_buf[0]) + 1);
        }
        if (includeDirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&includeDirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(includeDirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT71(includeDirs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   includeDirs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildType._M_dataplus._M_p != &buildType.field_2) {
          operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&libList);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)definitions._M_dataplus._M_p != &definitions.field_2) {
          operator_delete(definitions._M_dataplus._M_p,
                          CONCAT71(definitions.field_2._M_allocated_capacity._1_7_,
                                   definitions.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&srcs);
      }
      goto LAB_00294465;
    }
    if (mode._M_string_length == 7) {
      if (*(int *)(mode._M_dataplus._M_p + 3) == 0x454c4950 &&
          *(int *)mode._M_dataplus._M_p == 0x504d4f43) {
        includeFlags._M_dataplus._M_p = (pointer)&includeFlags.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&includeFlags,"PACKAGE_INCLUDE_DIRS","");
        psVar7 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            tVar6.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                            &includeFlags);
        includes._M_dataplus._M_p = (pointer)&includes.field_2;
        pcVar3 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&includes,pcVar3,pcVar3 + psVar7->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
          operator_delete(includeFlags._M_dataplus._M_p,
                          includeFlags.field_2._M_allocated_capacity + 1);
        }
        arg._M_str = includes._M_dataplus._M_p;
        arg._M_len = includes._M_string_length;
        cmExpandedList_abi_cxx11_(&includeDirs,arg,false);
        cmGlobalGenerator::CreateGenerationObjects
                  ((this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,AllTargets);
        paVar1 = &definitions.field_2;
        definitions._M_string_length = 0;
        definitions.field_2._M_local_buf[0] = '\0';
        definitions._M_dataplus._M_p = (pointer)paVar1;
        cmLocalGenerator::GetIncludeFlags
                  (&includeFlags,
                   (cmLocalGenerator *)
                   **(undefined8 **)
                     &(((this->GlobalGenerator)._M_t.
                        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                        .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->
                      LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl,&includeDirs,(cmGeneratorTarget *)0x0,&language,&definitions,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)definitions._M_dataplus._M_p != paVar1) {
          operator_delete(definitions._M_dataplus._M_p,
                          CONCAT71(definitions.field_2._M_allocated_capacity._1_7_,
                                   definitions.field_2._M_local_buf[0]) + 1);
        }
        buildType._M_dataplus._M_p = (pointer)&buildType.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&buildType,"PACKAGE_DEFINITIONS","");
        psVar7 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            tVar6.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                            &buildType);
        pcVar3 = (psVar7->_M_dataplus)._M_p;
        definitions._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&definitions,pcVar3,pcVar3 + psVar7->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildType._M_dataplus._M_p != &buildType.field_2) {
          operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
        }
        printf("%s %s\n",includeFlags._M_dataplus._M_p,definitions._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)definitions._M_dataplus._M_p != paVar1) {
          operator_delete(definitions._M_dataplus._M_p,
                          CONCAT71(definitions.field_2._M_allocated_capacity._1_7_,
                                   definitions.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
          operator_delete(includeFlags._M_dataplus._M_p,
                          includeFlags.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&includeDirs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includes._M_dataplus._M_p != &includes.field_2) {
          operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_00294465;
    }
    if ((mode._M_string_length != 5) ||
       (bVar5 || (mode._M_dataplus._M_p[4] != 'T' || *(int *)mode._M_dataplus._M_p != 0x53495845)))
    goto LAB_00294465;
    __format = "%s found.\n";
  }
  else {
    if (bVar5) goto LAB_00294465;
    __format = "%s not found.\n";
  }
  printf(__format,packageName._M_dataplus._M_p);
LAB_00294465:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)packageName._M_dataplus._M_p != &packageName.field_2) {
    operator_delete(packageName._M_dataplus._M_p,packageName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mode._M_dataplus._M_p != &mode.field_2) {
    operator_delete(mode._M_dataplus._M_p,mode.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != &systemFile.field_2) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_1a0);
  return bVar4;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  this->SetGlobalGenerator(cm::make_unique<cmGlobalGenerator>(this));

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  auto mfu = cm::make_unique<cmMakefile>(this->GetGlobalGenerator(), snapshot);
  cmMakefile* mf = mfu.get();
  this->GlobalGenerator->AddMakefile(std::move(mfu));

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST"_s) {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE"_s) {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs = cmExpandedList(includes);

    this->GlobalGenerator->CreateGenerationObjects();
    const auto& lg = this->GlobalGenerator->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language, std::string());

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK"_s) {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language);

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList = cmExpandedList(libs);
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    this->GlobalGenerator->CreateGenerationObjects();
    cmGeneratorTarget* gtgt =
      this->GlobalGenerator->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  return packageFound;
}